

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold_tracing.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::
Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
::
manifold_tracing_algorithm<std::vector<Eigen::Matrix<double,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<double,_1,1,0,_1,1>>>,Gudhi::coxeter_triangulation::Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>>
          (Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
           *this,vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *seed_points,
          Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          *triangulation,
          Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
          *oracle,Out_simplex_map *interior_simplex_map,Out_simplex_map *boundary_simplex_map)

{
  iterator_range_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  *piVar1;
  iterator_range_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  *piVar2;
  bool bVar3;
  type_conflict tVar4;
  reference pvVar5;
  reference pPVar6;
  reference pPVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_false,_false>,_bool>
  pVar8;
  undefined1 local_1a78 [8];
  Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  qrb_1;
  undefined1 local_1a40 [8];
  Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  qr_1;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  face_1;
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0_4;
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __begin0_4;
  Face_range *__range5;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  cof_1;
  Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0_3;
  Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __begin0_3;
  Coface_range *__range4_1;
  Simplex_handle s;
  undefined1 local_d98 [8];
  Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  qrb;
  Simplex_handle cof;
  Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0_2;
  Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __begin0_2;
  Coface_range *__range7;
  undefined1 local_448 [8];
  Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  qr;
  Simplex_handle face;
  undefined1 local_3f8 [8];
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0_1;
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __begin0_1;
  Face_range *__range4;
  undefined1 local_e0 [8];
  Simplex_handle full_simplex;
  Matrix<double,__1,_1,_0,__1,_1> *p;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *__range3;
  queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  queue;
  size_t cod_d;
  Out_simplex_map *boundary_simplex_map_local;
  Out_simplex_map *interior_simplex_map_local;
  Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
  *oracle_local;
  Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *triangulation_local;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *seed_points_local;
  Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  *this_local;
  
  queue.c.
  super__Deque_base<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
       ::cod_d(oracle);
  std::
  queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>>
  ::
  queue<std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>,void>
            ((queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>>
              *)&__range3);
  __end0 = std::
           vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::begin(seed_points);
  p = (Matrix<double,__1,_1,_0,__1,_1> *)
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::end(seed_points);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_*,_std::vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                     *)&p), bVar3) {
    full_simplex.partition_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
                  ::operator*(&__end0);
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
    ::locate_point<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Simplex_handle *)local_e0,triangulation,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               full_simplex.partition_.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,1.0);
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::face_range((Face_range *)
                 &__begin0_1.value_.partition_.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)local_e0,
                 (size_t)queue.c.
                         super__Deque_base<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node);
    piVar1 = (iterator_range_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
              *)&__begin0_1.value_.partition_.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    boost::iterator_range_detail::
    iterator_range_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
    ::begin((Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)&__end0_1.value_.partition_.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,piVar1);
    boost::iterator_range_detail::
    iterator_range_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
    ::end((Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *)local_3f8,piVar1);
    while (tVar4 = boost::iterators::operator!=
                             ((iterator_facade<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long>
                               *)&__end0_1.value_.partition_.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (iterator_facade<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long>
                               *)local_3f8), tVar4) {
      pPVar7 = boost::iterators::detail::
               iterator_facade_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
               ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                            *)&__end0_1.value_.partition_.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::Permutahedral_representation
                ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)&qr.success,pPVar7);
      Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
      ::
      intersects<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
                ((Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)local_448,
                 (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
                  *)oracle,
                 (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)&qr.success,triangulation);
      if (((byte)qr.intersection.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows & 1) != 0) {
        bVar3 = Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
                ::
                lies_in_domain<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
                          ((Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
                            *)oracle,(VectorXd *)local_448,triangulation);
        if (bVar3) {
          pVar8 = std::
                  unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,-1,1,0,-1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,-1,1,0,-1,1>>>>
                  ::
                  emplace<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>&,Eigen::Matrix<double,_1,1,0,_1,1>&>
                            ((unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,_1,1,0,_1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,_1,1,0,_1,1>>>>
                              *)interior_simplex_map,
                             (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)&qr.success,(Matrix<double,__1,_1,_0,__1,_1> *)local_448);
          if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::
            queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>>
            ::
            emplace<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>&>
                      ((queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>>
                        *)&__range3,
                       (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)&qr.success);
          }
        }
        else {
          Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::coface_range((Coface_range *)
                         &__begin0_2.value_.partition_.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)&qr.success,
                         (long)queue.c.
                               super__Deque_base<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node + 1);
          piVar2 = (iterator_range_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                    *)&__begin0_2.value_.partition_.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          boost::iterator_range_detail::
          iterator_range_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
          ::begin((Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)&__end0_2.value_.partition_.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,piVar2);
          boost::iterator_range_detail::
          iterator_range_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
          ::end((Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)&cof.partition_.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,piVar2);
          while (tVar4 = boost::iterators::operator!=
                                   ((iterator_facade<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long>
                                     *)&__end0_2.value_.partition_.
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (iterator_facade<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long>
                                     *)&cof.partition_.
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), tVar4)
          {
            pPVar6 = boost::iterators::detail::
                     iterator_facade_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                     ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                                  *)&__end0_2.value_.partition_.
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::Permutahedral_representation
                      ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)&qrb.success,pPVar6);
            Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
            ::
            intersects_boundary<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
                      ((Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)local_d98,
                       (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
                        *)oracle,
                       (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)&qrb.success,triangulation);
            if (((byte)qrb.intersection.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows & 1) != 0) {
              pVar8 = std::
                      unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,-1,1,0,-1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,-1,1,0,-1,1>>>>
                      ::
                      emplace<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>&,Eigen::Matrix<double,_1,1,0,_1,1>&>
                                ((unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,_1,1,0,_1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,_1,1,0,_1,1>>>>
                                  *)boundary_simplex_map,
                                 (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                  *)&qrb.success,(Matrix<double,__1,_1,_0,__1,_1> *)local_d98);
              s.partition_.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)pVar8.first.
                            super__Node_iterator_base<std::pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_false>
                            ._M_cur;
            }
            Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::~Query_result((Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             *)local_d98);
            Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::~Permutahedral_representation
                      ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)&qrb.success);
            boost::iterators::detail::
            iterator_facade_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
            ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                          *)&__end0_2.value_.partition_.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~Coface_iterator((Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              *)&cof.partition_.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~Coface_iterator((Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              *)&__end0_2.value_.partition_.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          boost::
          iterator_range<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
          ::~iterator_range((iterator_range<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                             *)&__begin0_2.value_.partition_.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~Query_result((Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       *)local_448);
      Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~Permutahedral_representation
                ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)&qr.success);
      boost::iterators::detail::
      iterator_facade_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                    *)&__end0_1.value_.partition_.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~Face_iterator((Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)local_3f8);
    Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~Face_iterator((Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)&__end0_1.value_.partition_.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    boost::
    iterator_range<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~iterator_range((iterator_range<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                       *)&__begin0_1.value_.partition_.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::~Permutahedral_representation
              ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                *)local_e0);
    __gnu_cxx::
    __normal_iterator<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
    ::operator++(&__end0);
  }
  while (bVar3 = std::
                 queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                 ::empty((queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                          *)&__range3), ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::
             queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
             ::front((queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                      *)&__range3);
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::Permutahedral_representation
              ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                *)&__range4_1,pvVar5);
    std::
    queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
    ::pop((queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
           *)&__range3);
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::coface_range((Coface_range *)
                   &__begin0_3.value_.partition_.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)&__range4_1,
                   (long)queue.c.
                         super__Deque_base<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node + 1);
    piVar2 = (iterator_range_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
              *)&__begin0_3.value_.partition_.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    boost::iterator_range_detail::
    iterator_range_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
    ::begin((Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)&__end0_3.value_.partition_.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,piVar2);
    boost::iterator_range_detail::
    iterator_range_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
    ::end((Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *)&cof_1.partition_.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,piVar2);
    while (tVar4 = boost::iterators::operator!=
                             ((iterator_facade<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long>
                               *)&__end0_3.value_.partition_.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (iterator_facade<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long>
                               *)&cof_1.partition_.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage), tVar4) {
      pPVar6 = boost::iterators::detail::
               iterator_facade_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
               ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                            *)&__end0_3.value_.partition_.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::Permutahedral_representation
                ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)&__range5,pPVar6);
      Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::face_range((Face_range *)
                   &__begin0_4.value_.partition_.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)&__range5,
                   (size_t)queue.c.
                           super__Deque_base<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
      piVar1 = (iterator_range_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                *)&__begin0_4.value_.partition_.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      boost::iterator_range_detail::
      iterator_range_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
      ::begin((Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               *)&__end0_4.value_.partition_.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,piVar1);
      boost::iterator_range_detail::
      iterator_range_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
      ::end((Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)&face_1.partition_.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,piVar1);
      while (tVar4 = boost::iterators::operator!=
                               ((iterator_facade<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long>
                                 *)&__end0_4.value_.partition_.
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (iterator_facade<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long>
                                 *)&face_1.partition_.
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage), tVar4) {
        pPVar7 = boost::iterators::detail::
                 iterator_facade_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                 ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                              *)&__end0_4.value_.partition_.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::Permutahedral_representation
                  ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)&qr_1.success,pPVar7);
        Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
        ::
        intersects<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
                  ((Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)local_1a40,
                   (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
                    *)oracle,
                   (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)&qr_1.success,triangulation);
        if (((byte)qr_1.intersection.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows & 1) != 0) {
          bVar3 = Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
                  ::
                  lies_in_domain<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
                            ((Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
                              *)oracle,(VectorXd *)local_1a40,triangulation);
          if (bVar3) {
            pVar8 = std::
                    unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,-1,1,0,-1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,-1,1,0,-1,1>>>>
                    ::
                    emplace<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>&,Eigen::Matrix<double,_1,1,0,_1,1>&>
                              ((unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,_1,1,0,_1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,_1,1,0,_1,1>>>>
                                *)interior_simplex_map,
                               (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                *)&qr_1.success,(Matrix<double,__1,_1,_0,__1,_1> *)local_1a40);
            qrb_1._16_8_ = pVar8.first.
                           super__Node_iterator_base<std::pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_false>
                           ._M_cur;
            if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::
              queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>>
              ::
              emplace<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>&>
                        ((queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>>
                          *)&__range3,
                         (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)&qr_1.success);
            }
          }
          else {
            Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
            ::
            intersects_boundary<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
                      ((Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)local_1a78,
                       (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
                        *)oracle,
                       (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)&__range5,triangulation);
            if (((byte)qrb_1.intersection.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows & 1) != 0) {
              std::
              unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,-1,1,0,-1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,-1,1,0,-1,1>>>>
              ::
              emplace<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>&,Eigen::Matrix<double,_1,1,0,_1,1>&>
                        ((unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,_1,1,0,_1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,_1,1,0,_1,1>>>>
                          *)boundary_simplex_map,
                         (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)&__range5,(Matrix<double,__1,_1,_0,__1,_1> *)local_1a78);
            }
            Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::~Query_result((Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             *)local_1a78);
          }
        }
        Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~Query_result((Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         *)local_1a40);
        Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::~Permutahedral_representation
                  ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)&qr_1.success);
        boost::iterators::detail::
        iterator_facade_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
        ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                      *)&__end0_4.value_.partition_.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~Face_iterator((Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)&face_1.partition_.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~Face_iterator((Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)&__end0_4.value_.partition_.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      boost::
      iterator_range<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
      ::~iterator_range((iterator_range<Gudhi::coxeter_triangulation::Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                         *)&__begin0_4.value_.partition_.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~Permutahedral_representation
                ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)&__range5);
      boost::iterators::detail::
      iterator_facade_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_&,_long,_false,_false>
                    *)&__end0_3.value_.partition_.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~Coface_iterator((Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)&cof_1.partition_.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~Coface_iterator((Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)&__end0_3.value_.partition_.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    boost::
    iterator_range<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~iterator_range((iterator_range<Gudhi::coxeter_triangulation::Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                       *)&__begin0_3.value_.partition_.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::~Permutahedral_representation
              ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                *)&__range4_1);
  }
  std::
  queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  ::~queue((queue<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::deque<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::allocator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
            *)&__range3);
  return;
}

Assistant:

void manifold_tracing_algorithm(const Point_range& seed_points, const Triangulation_& triangulation,
                                  const Intersection_oracle& oracle, Out_simplex_map& interior_simplex_map,
                                  Out_simplex_map& boundary_simplex_map) {
    std::size_t cod_d = oracle.cod_d();
    std::queue<Simplex_handle> queue;

    for (const auto& p : seed_points) {
      Simplex_handle full_simplex = triangulation.locate_point(p);
      for (Simplex_handle face : full_simplex.face_range(cod_d)) {
        auto qr = oracle.intersects(face, triangulation);
#ifdef DEBUG_TRACES
        mt_seed_inserted_list.push_back(MT_inserted_info(qr, face, false));
#endif
        if (qr.success) {
          if (oracle.lies_in_domain(qr.intersection, triangulation)) {
            if (interior_simplex_map.emplace(face, qr.intersection).second) queue.emplace(face);
          } else {
            for (Simplex_handle cof : face.coface_range(cod_d + 1)) {
              auto qrb = oracle.intersects_boundary(cof, triangulation);
#ifdef DEBUG_TRACES
              mt_seed_inserted_list.push_back(MT_inserted_info(qrb, cof, true));
#endif
              if (qrb.success) boundary_simplex_map.emplace(cof, qrb.intersection);
            }
          }
          // break;
        }
      }
    }

    while (!queue.empty()) {
      Simplex_handle s = queue.front();
      queue.pop();
      for (auto cof : s.coface_range(cod_d + 1)) {
        for (auto face : cof.face_range(cod_d)) {
          auto qr = oracle.intersects(face, triangulation);
#ifdef DEBUG_TRACES
          mt_inserted_list.push_back(MT_inserted_info(qr, face, false));
#endif
          if (qr.success) {
            if (oracle.lies_in_domain(qr.intersection, triangulation)) {
              if (interior_simplex_map.emplace(face, qr.intersection).second) queue.emplace(face);
            } else {
              auto qrb = oracle.intersects_boundary(cof, triangulation);
#ifdef DEBUG_TRACES
              mt_inserted_list.push_back(MT_inserted_info(qrb, cof, true));
#endif
              if (qrb.success) boundary_simplex_map.emplace(cof, qrb.intersection);
            }
          }
        }
      }
    }
  }